

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NGramStorageTest.cpp
# Opt level: O2

uint32_t get_continuations_count
                   (vector<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
                    *ngrams,vector<unsigned_int,_std::allocator<unsigned_int>_> *ngram)

{
  pointer ppVar1;
  long lVar2;
  pointer puVar3;
  uint32_t uVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  ppVar1 = (ngrams->
           super__Vector_base<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar4 = 0;
  uVar7 = 0;
  while( true ) {
    uVar8 = (ulong)uVar7;
    if ((ulong)((long)(ngrams->
                      super__Vector_base<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>,_std::allocator<std::pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 5) <= uVar8)
    break;
    lVar2 = *(long *)&ppVar1[uVar8].first.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
    puVar3 = (ngram->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (long)(ngram->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar3;
    if (uVar9 < (ulong)((long)*(pointer *)
                               ((long)&ppVar1[uVar8].first.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl + 8) - lVar2)) {
      bVar5 = true;
      for (uVar6 = 0; uVar6 < (ulong)((long)uVar9 >> 2); uVar6 = (ulong)((int)uVar6 + 1)) {
        bVar5 = (bool)(bVar5 & *(uint *)(lVar2 + uVar6 * 4) == puVar3[uVar6]);
      }
      if (bVar5) {
        uVar4 = uVar4 + ppVar1[uVar8].second;
      }
    }
    uVar7 = uVar7 + 1;
  }
  return uVar4;
}

Assistant:

uint32_t get_continuations_count(vector<pair<vector<uint32_t>, uint32_t>>& ngrams,
                                 vector<uint32_t> ngram) {
    uint32_t res = 0;
    for (uint32_t i = 0; i < ngrams.size(); i++) {
        if (ngrams[i].first.size() > ngram.size()) {
            bool same = true;
            for (uint32_t j = 0; j < ngram.size(); j++)
                same &= ngrams[i].first[j] == ngram[j];
            if (same)
                res += ngrams[i].second;
        }
    }

    return res;
}